

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

void wasm::Literal::printVec128(ostream *o,array<unsigned_char,_16UL> *v)

{
  value_type_conflict vVar1;
  value_type_conflict vVar2;
  value_type_conflict vVar3;
  _Setfill<char> _Var4;
  _Setw _Var5;
  ostream *poVar6;
  const_reference pvVar7;
  int local_1c;
  int i;
  array<unsigned_char,_16UL> *v_local;
  ostream *o_local;
  
  std::ostream::operator<<(o,std::hex);
  for (local_1c = 0; local_1c < 0x10; local_1c = local_1c + 4) {
    if (local_1c != 0) {
      std::operator<<(o," ");
    }
    poVar6 = std::operator<<(o,"0x");
    _Var4 = std::setfill<char>('0');
    poVar6 = std::operator<<(poVar6,_Var4._M_c);
    _Var5 = std::setw(8);
    poVar6 = std::operator<<(poVar6,_Var5);
    pvVar7 = std::array<unsigned_char,_16UL>::operator[](v,(long)local_1c);
    vVar1 = *pvVar7;
    pvVar7 = std::array<unsigned_char,_16UL>::operator[](v,(long)(local_1c + 1));
    vVar2 = *pvVar7;
    pvVar7 = std::array<unsigned_char,_16UL>::operator[](v,(long)(local_1c + 2));
    vVar3 = *pvVar7;
    pvVar7 = std::array<unsigned_char,_16UL>::operator[](v,(long)(local_1c + 3));
    std::ostream::operator<<(poVar6,CONCAT13(*pvVar7,CONCAT12(vVar3,CONCAT11(vVar2,vVar1))));
  }
  std::ostream::operator<<(o,std::dec);
  return;
}

Assistant:

void Literal::printVec128(std::ostream& o, const std::array<uint8_t, 16>& v) {
  o << std::hex;
  for (auto i = 0; i < 16; i += 4) {
    if (i) {
      o << " ";
    }
    o << "0x" << std::setfill('0') << std::setw(8)
      << uint32_t(v[i] | (v[i + 1] << 8) | (v[i + 2] << 16) | (v[i + 3] << 24));
  }
  o << std::dec;
}